

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::OnMessage(Client *this,Handle *handle,BufferPtr *data,uint32_t len)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  shared_ptr<cppnet::Buffer> local_50;
  shared_ptr<cppnet::CNSocket> local_40;
  Session *local_30;
  Session *session;
  BufferPtr *pBStack_20;
  uint32_t len_local;
  BufferPtr *data_local;
  Handle *handle_local;
  Client *this_local;
  
  session._4_4_ = len;
  pBStack_20 = data;
  data_local = (BufferPtr *)handle;
  handle_local = (Handle *)this;
  peVar2 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)handle);
  iVar1 = (*peVar2->_vptr_CNSocket[10])();
  local_30 = (Session *)CONCAT44(extraout_var,iVar1);
  std::shared_ptr<cppnet::CNSocket>::shared_ptr(&local_40,handle);
  std::shared_ptr<cppnet::Buffer>::shared_ptr(&local_50,data);
  Session::OnMessage((Session *)CONCAT44(extraout_var,iVar1),&local_40,&local_50,session._4_4_);
  std::shared_ptr<cppnet::Buffer>::~shared_ptr(&local_50);
  std::shared_ptr<cppnet::CNSocket>::~shared_ptr(&local_40);
  return;
}

Assistant:

void OnMessage(cppnet::Handle handle, cppnet::BufferPtr data, uint32_t len) {
        auto session = (Session*)handle->GetContext();
        session->OnMessage(handle, data, len);
    }